

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

uint32_t cpu_ldl_code_sparc(CPUArchState_conflict16 *env,abi_ptr_conflict addr)

{
  uint64_t uVar1;
  uint uVar2;
  
  if ((env->mmuregs[0] & 1) == 0) {
    uVar2 = 2;
  }
  else {
    uVar2 = env->psrs;
  }
  uVar1 = full_ldl_code(env,addr,uVar2 | 0xa0,0);
  return (uint32_t)uVar1;
}

Assistant:

static inline int cpu_mmu_index(CPUSPARCState *env, bool ifetch)
{
#if !defined(TARGET_SPARC64)
    if ((env->mmuregs[0] & MMU_E) == 0) { /* MMU disabled */
        return MMU_PHYS_IDX;
    } else {
        return env->psrs;
    }
#else
    /* IMMU or DMMU disabled.  */
    if (ifetch
        ? (env->lsu & IMMU_E) == 0 || (env->pstate & PS_RED) != 0
        : (env->lsu & DMMU_E) == 0) {
        return MMU_PHYS_IDX;
    } else if (cpu_hypervisor_mode(env)) {
        return MMU_PHYS_IDX;
    } else if (env->tl > 0) {
        return MMU_NUCLEUS_IDX;
    } else if (cpu_supervisor_mode(env)) {
        return MMU_KERNEL_IDX;
    } else {
        return MMU_USER_IDX;
    }
#endif
}